

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

UCVarValue FBaseCVar::FromBool(bool value,ECVarType type)

{
  ECVarType type_local;
  undefined4 uStack_c;
  bool value_local;
  UCVarValue ret;
  
  switch(type) {
  case CVAR_Bool:
    _type_local = (char *)CONCAT71(stack0xfffffffffffffff1,value);
    break;
  case CVAR_Int:
    _type_local = (char *)CONCAT44(uStack_c,(uint)value);
    break;
  case CVAR_Float:
    _type_local = (char *)CONCAT44(uStack_c,(float)value);
    break;
  case CVAR_String:
    _type_local = falsestr;
    if (value) {
      _type_local = truestr;
    }
    break;
  default:
    break;
  case CVAR_GUID:
    _type_local = (char *)0x0;
  }
  return (UCVarValue)_type_local;
}

Assistant:

UCVarValue FBaseCVar::FromBool (bool value, ECVarType type)
{
	UCVarValue ret;

	switch (type)
	{
	case CVAR_Bool:
		ret.Bool = value;
		break;

	case CVAR_Int:
		ret.Int = value;
		break;

	case CVAR_Float:
		ret.Float = value;
		break;

	case CVAR_String:
		ret.String = value ? truestr : falsestr;
		break;

	case CVAR_GUID:
		ret.pGUID = NULL;
		break;

	default:
		break;
	}

	return ret;
}